

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

bool Js::IsWhiteSpaceCharacter(char16 ch)

{
  if (8 < (ushort)ch) {
    if ((ushort)ch < 0xe) {
      return true;
    }
    if ((ushort)ch < 0x200b) {
      return (ch == L'\x1680' || 0x1fff < (ushort)ch) || (ch & 0x3f7fU) == 0x20;
    }
    if (0x2027 < (ushort)ch) {
      if ((ushort)ch < 0x202a) {
        return true;
      }
      if (ch == L'\x202f') {
        return true;
      }
      if (ch == L'\x205f') {
        return true;
      }
      if (ch == L'\x3000') {
        return true;
      }
      if (ch == L'\xfeff') {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool IsWhiteSpaceCharacter(char16 ch)
    {
        return ch >= 0x9 &&
            (ch <= 0xd ||
                (ch <= 0x200a &&
                    (ch >= 0x2000 || ch == 0x20 || ch == 0xa0 || ch == 0x1680)
                ) ||
                (ch >= 0x2028 &&
                    (ch <= 0x2029 || ch == 0x202f || ch == 0x205f || ch == 0x3000 || ch == 0xfeff)
                )
            );
    }